

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_writemap.cpp
# Opt level: O2

void Cmd_dumpmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  double *pdVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  char *pcVar6;
  int i_2;
  int i_3;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 local_114;
  undefined2 local_110;
  undefined2 local_10c;
  wadinfo_t header;
  wadlump_t lumps [12];
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    pcVar6 = "Usage: dumpmap <wadname> [mapname]\n";
  }
  else {
    if (gamestate == GS_LEVEL) {
      iVar2 = FCommandLine::argc(argv);
      if (iVar2 < 3) {
        pcVar6 = "MAP01";
        if (((byte)gameinfo.flags & 1) == 0) {
          pcVar6 = "E1M1";
        }
      }
      else {
        pcVar6 = FCommandLine::operator[](argv,2);
      }
      __filename = FCommandLine::operator[](argv,1);
      __stream = fopen(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        pcVar6 = FCommandLine::operator[](argv,1);
        Printf("Cannot write %s\n",pcVar6);
        return;
      }
      header.Magic = 0x44415750;
      header.NumLumps = 0xc;
      header.InfoTableOfs = 0;
      lVar5 = 0;
      memset(lumps,0,0xc0);
      fseek(__stream,0xc,0);
      lumps[0].FilePos = 0xc;
      lumps[0].Size = 0;
      uppercopy(lumps[0].Name,pcVar6);
      lVar3 = ftell(__stream);
      lumps[1].FilePos = (DWORD)lVar3;
      local_118 = 0;
      lVar3 = (&players)[(long)consoleplayer * 0x54];
      auVar7._0_4_ = (int)*(double *)(lVar3 + 0x48);
      auVar7._4_4_ = (int)*(double *)(lVar3 + 0x50);
      auVar7._8_8_ = 0;
      auVar7 = pshuflw(auVar7,auVar7,0xe8);
      local_128 = (ulong)auVar7._0_4_ << 0x10;
      uStack_120._0_6_ = CONCAT42(0x1e70001,(short)(int)*(double *)(lVar3 + 0x90));
      uStack_120 = (ulong)(uint6)uStack_120;
      fwrite(&local_128,0x14,1,__stream);
      lumps[1].Size = 0x14;
      builtin_strncpy(lumps[1].Name,"THINGS",6);
      lVar3 = ftell(__stream);
      lumps[2].FilePos = (DWORD)lVar3;
      lVar3 = 0x2c;
      for (; lVar4 = local_128, lVar5 < numlines; lVar5 = lVar5 + 1) {
        local_128._7_1_ = SUB81(lVar4,7);
        local_128._0_7_ =
             CONCAT16((char)lines[lVar5].special,
                      CONCAT24((short)lines[lVar5].flags,
                               CONCAT22((short)(((long)lines[lVar5].v2 - (long)vertexes) / 0x38),
                                        (short)(((long)lines[lVar5].v1 - (long)vertexes) / 0x38))));
        for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
          *(undefined1 *)((long)&local_128 + lVar4 + 7) =
               *(undefined1 *)((long)lines->args + lVar4 * 4 + lVar3 + -0x2c);
        }
        uStack_120._0_6_ =
             CONCAT24((short)(((long)lines[lVar5].sidedef[0] - (long)sides) / 0xd8),
                      (undefined4)uStack_120);
        uStack_120 = CONCAT26((short)(((long)lines[lVar5].sidedef[1] - (long)sides) / 0xd8),
                              (uint6)uStack_120);
        fwrite(&local_128,0x10,1,__stream);
        lVar3 = lVar3 + 0x98;
      }
      lumps[2].Size = numlines << 4;
      builtin_strncpy(lumps[2].Name,"LINEDEFS",8);
      lVar3 = ftell(__stream);
      lumps[3].FilePos = (DWORD)lVar3;
      lVar5 = 0;
      for (lVar3 = 0; lVar3 < numsides; lVar3 = lVar3 + 1) {
        pdVar1 = (double *)((long)&sides->textures[1].xOffset + lVar5);
        auVar8._0_4_ = (int)*pdVar1;
        auVar8._4_4_ = (int)pdVar1[1];
        auVar8._8_8_ = 0;
        auVar7 = pshuflw(auVar8,auVar8,0xe8);
        local_128 = CONCAT44(local_128._4_4_,auVar7._0_4_);
        local_10c = (undefined2)
                    ((*(long *)((long)sides->textures + lVar5 + -0x10) - (long)sectors) / 0x268);
        pcVar6 = GetTextureName((FTextureID)
                                *(int *)((long)&sides->textures[0].texture.texnum + lVar5));
        uppercopy((char *)((long)&local_128 + 4),pcVar6);
        pcVar6 = GetTextureName((FTextureID)
                                *(int *)((long)&sides->textures[2].texture.texnum + lVar5));
        uppercopy((char *)((long)&uStack_120 + 4),pcVar6);
        pcVar6 = GetTextureName((FTextureID)
                                *(int *)((long)&sides->textures[1].texture.texnum + lVar5));
        uppercopy((char *)&local_114,pcVar6);
        fwrite(&local_128,0x1e,1,__stream);
        lVar5 = lVar5 + 0xd8;
      }
      lumps[3].Size = numsides * 0x1e;
      builtin_strncpy(lumps[3].Name,"SIDEDEFS",8);
      lVar3 = ftell(__stream);
      lumps[4].FilePos = (DWORD)lVar3;
      lVar3 = 0;
      for (lVar5 = 0; lVar5 < numvertexes; lVar5 = lVar5 + 1) {
        pdVar1 = (double *)((long)&(vertexes->p).X + lVar3);
        dVar12 = pdVar1[1] + 103079215104.0;
        auVar9._0_4_ = (undefined4)((ulong)(*pdVar1 + 103079215104.0) >> 0x10);
        auVar9._8_4_ = (undefined4)((ulong)dVar12 >> 0x10);
        auVar9._4_4_ = auVar9._8_4_;
        auVar9._12_2_ = (short)((ulong)dVar12 >> 0x30);
        auVar9._14_2_ = 0;
        auVar7 = pshuflw(auVar9,auVar9,0xe8);
        local_128 = CONCAT44(local_128._4_4_,auVar7._0_4_);
        fwrite(&local_128,4,1,__stream);
        lVar3 = lVar3 + 0x38;
      }
      lumps[4].Size = numvertexes << 2;
      builtin_strncpy(lumps[4].Name,"VERTEXES",8);
      lVar3 = ftell(__stream);
      lumps[5].FilePos = (DWORD)lVar3;
      lumps[5].Size = 0;
      builtin_strncpy(lumps[5].Name,"SEGS",4);
      lVar3 = ftell(__stream);
      lumps[6].FilePos = (DWORD)lVar3;
      lumps[6].Size = 0;
      builtin_strncpy(lumps[6].Name,"SSECTORS",8);
      lVar3 = ftell(__stream);
      lumps[7].FilePos = (DWORD)lVar3;
      lumps[7].Size = 0;
      builtin_strncpy(lumps[7].Name,"NODES",5);
      lVar3 = ftell(__stream);
      lumps[8].FilePos = (DWORD)lVar3;
      lVar3 = 0;
      for (lVar5 = 0; lVar5 < numsectors; lVar5 = lVar5 + 1) {
        auVar10._0_4_ = (int)*(double *)((long)&sectors->planes[0].TexZ + lVar3);
        auVar10._4_4_ = (int)*(double *)((long)&sectors->planes[1].TexZ + lVar3);
        auVar10._8_8_ = 0;
        auVar7 = pshuflw(auVar10,auVar10,0xe8);
        local_128 = CONCAT44(local_128._4_4_,auVar7._0_4_);
        pcVar6 = GetTextureName((FTextureID)
                                *(int *)((long)&sectors->planes[0].Texture.texnum + lVar3));
        uppercopy((char *)((long)&local_128 + 4),pcVar6);
        pcVar6 = GetTextureName((FTextureID)
                                *(int *)((long)&sectors->planes[1].Texture.texnum + lVar3));
        uppercopy((char *)((long)&uStack_120 + 4),pcVar6);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)sectors->terrainnum + lVar3 + -0x40);
        auVar7 = pshuflw(auVar11,auVar11,0xe1);
        local_114 = auVar7._0_4_;
        iVar2 = FTagManager::GetFirstSectorTag
                          (&tagManager,(sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar3));
        local_110 = (undefined2)iVar2;
        fwrite(&local_128,0x1a,1,__stream);
        lVar3 = lVar3 + 0x268;
      }
      lumps[8].Size = numsectors * 0x1a;
      builtin_strncpy(lumps[8].Name,"SECTORS",7);
      lVar3 = ftell(__stream);
      lumps[9].FilePos = (DWORD)lVar3;
      lumps[9].Size = 0;
      builtin_strncpy(lumps[9].Name,"REJECT",6);
      lVar3 = ftell(__stream);
      lumps[10].FilePos = (DWORD)lVar3;
      lumps[10].Size = 0;
      builtin_strncpy(lumps[10].Name,"BLOCKMAP",8);
      lVar3 = ftell(__stream);
      lumps[0xb].FilePos = (DWORD)lVar3;
      fwrite(WriteBEHAVIOR(_IO_FILE*)::dummy,0x10,1,__stream);
      lumps[0xb].Size = 0x10;
      builtin_strncpy(lumps[0xb].Name,"BEHAVIOR",8);
      lVar3 = ftell(__stream);
      header.InfoTableOfs = (DWORD)lVar3;
      fwrite(lumps,0x10,0xc,__stream);
      fseek(__stream,0,0);
      fwrite(&header,0xc,1,__stream);
      fclose(__stream);
      return;
    }
    pcVar6 = "You can only dump a map when inside a level.\n";
  }
  Printf(pcVar6);
  return;
}

Assistant:

CCMD (dumpmap)
{
	const char *mapname;
	FILE *file;

	if (argv.argc() < 2)
	{
		Printf ("Usage: dumpmap <wadname> [mapname]\n");
		return;
	}
	
	if (gamestate != GS_LEVEL)
	{
		Printf ("You can only dump a map when inside a level.\n");
		return;
	}

	if (argv.argc() < 3)
	{
		if (gameinfo.flags & GI_MAPxx)
		{
			mapname = "MAP01";
		}
		else
		{
			mapname = "E1M1";
		}
	}
	else
	{
		mapname = argv[2];
	}

	file = fopen (argv[1], "wb");
	if (file == NULL)
	{
		Printf ("Cannot write %s\n", argv[1]);
		return;
	}

	wadinfo_t header = { PWAD_ID, 12, 0 };
	wadlump_t lumps[12] = { {0, 0, {0}} };

	fseek (file, 12, SEEK_SET);
	
	lumps[0].FilePos = LittleLong(12);
	lumps[0].Size = 0;
	uppercopy (lumps[0].Name, mapname);

	APPEND(1, THINGS);
	APPEND(2, LINEDEFS);
	APPEND(3, SIDEDEFS);
	APPEND(4, VERTEXES);
	APPEND(5, SEGS);
	APPEND(6, SSECTORS);
	APPEND(7, NODES);
	APPEND(8, SECTORS);
	APPEND(9, REJECT);
	APPEND(10, BLOCKMAP);
	APPEND(11, BEHAVIOR);

	header.InfoTableOfs = ftell (file);

	fwrite (lumps, 16, 12, file);
	fseek (file, 0, SEEK_SET);
	fwrite (&header, 12, 1, file);

	fclose (file);
}